

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
embree::XMLLoader::loadUIntArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  byte bVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  long *in_RDX;
  string *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *data;
  Ref<embree::XML> *in_stack_00000198;
  XMLLoader *in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  XML *in_stack_ffffffffffffff68;
  ulong uVar5;
  ulong __n;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  long *local_38;
  long *local_20;
  long *local_18;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x37d322);
  }
  else {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*in_RDX;
    local_38 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"ofs",&local_79);
    XML::parm(in_stack_ffffffffffffff68,in_RSI);
    bVar1 = std::operator!=(in_stack_ffffffffffffff20,
                            (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if ((bVar1 & 1) == 0) {
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 & 0xffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x37d44b);
      local_18 = local_38;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_38 + 0x98));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (this_00,CONCAT17(bVar1,in_stack_ffffffffffffff38));
      uVar5 = 0;
      while (__n = uVar5,
            sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI),
            uVar5 < sVar3) {
        local_20 = local_38;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_38 + 0x98),__n);
        vVar2 = Token::Int((Token *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,__n);
        *pvVar4 = vVar2;
        uVar5 = __n + 1;
      }
    }
    else {
      loadBinary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                (in_stack_000001a0,in_stack_00000198);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<unsigned> XMLLoader::loadUIntArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<unsigned>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<unsigned>>(xml);
    } 
    else 
    {
      std::vector<unsigned> data;
      data.resize(xml->body.size());
      for (size_t i=0; i<data.size(); i++) 
        data[i] = xml->body[i].Int();
      return data;
    }
  }